

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,CaseShaderType shaderType)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((int)this == 1) {
    __a = &local_a;
  }
  else {
    if ((int)this != 0) {
      __a = &local_b;
      __s = (char *)0x0;
      goto LAB_0114944c;
    }
    __a = &local_9;
  }
  __s = "highp";
LAB_0114944c:
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static inline string getShaderPrecision (CaseShaderType shaderType)
{
	switch (shaderType)
	{
		case CASESHADERTYPE_VERTEX:		return "highp";
		case CASESHADERTYPE_FRAGMENT:	return "highp";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}